

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::Flush(CWallet *this)

{
  long lVar1;
  WalletDatabase *pWVar2;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = GetDatabase(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*pWVar2->_vptr_WalletDatabase[7])
              (pWVar2,in_RSI,*(long *)(in_FS_OFFSET + 0x28),pWVar2->_vptr_WalletDatabase[7]);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::Flush()
{
    GetDatabase().Flush();
}